

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

void __thiscall cmProcess::OnTimeout(cmProcess *this)

{
  bool bVar1;
  State SVar2;
  cmCTestTestProperties *pcVar3;
  uv_process_s *puVar4;
  _Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true> _Var5;
  
  SVar2 = this->ProcessState;
  this->ProcessState = Expired;
  if (((SVar2 == Executing) && (this->TimeoutReason_ == Normal)) &&
     (pcVar3 = ((this->Runner)._M_t.
                super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->TestProperties,
     *(bool *)((long)&(pcVar3->TimeoutSignal).
                      super__Optional_base<cmCTestTestHandler::Signal,_false,_false> + 0x28) == true
     )) {
    this->TerminationStyle = Custom;
    puVar4 = ::cm::uv_handle_ptr_::operator_cast_to_uv_process_s_
                       (&(this->Process).super_uv_handle_ptr_<uv_process_s>);
    uv_process_kill(puVar4,*(int *)&(pcVar3->TimeoutSignal).
                                    super__Optional_base<cmCTestTestHandler::Signal,_false,_false>.
                                    _M_payload);
    bVar1 = (this->Timeout).
            super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>.
            _M_engaged;
    if (*(bool *)((long)&(pcVar3->TimeoutGracePeriod).
                         super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
                 + 8) == true) {
      _Var5 = *(_Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true> *)
               &(pcVar3->TimeoutGracePeriod).
                super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
      ;
    }
    else {
      _Var5 = (_Storage<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true>)0x3ff0000000000000
      ;
    }
    (this->Timeout).
    super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>._M_payload.
    super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>._M_payload =
         _Var5;
    if (bVar1 == false) {
      (this->Timeout).
      super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>.
      _M_engaged = true;
    }
    if ((this->Timeout).
        super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
        _M_payload.super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
        ._M_engaged == true) {
      ::cm::uv_timer_ptr::start
                (&this->Timer,OnTimeoutCB,
                 (long)((double)(this->Timeout).
                                super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
                                ._M_payload * 1000.0),0);
      return;
    }
  }
  else {
    this->TerminationStyle = Forced;
    bVar1 = this->ReadHandleClosed;
    if (bVar1 == false) {
      this->ReadHandleClosed = true;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
                ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
    }
    if (this->ProcessHandleClosed == false) {
      puVar4 = ::cm::uv_handle_ptr_base_<uv_process_s>::operator->
                         ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
      cmsysProcess_KillPID((long)puVar4->pid);
      return;
    }
    if (bVar1 == false) {
      Finish(this);
      return;
    }
  }
  return;
}

Assistant:

void cmProcess::OnTimeout()
{
  bool const wasExecuting = this->ProcessState == cmProcess::State::Executing;
  this->ProcessState = cmProcess::State::Expired;

  // If the test process is still executing normally, and we timed out because
  // the test timeout was reached, send the custom timeout signal, if any.
  if (wasExecuting && this->TimeoutReason_ == TimeoutReason::Normal) {
    cmCTestTestHandler::cmCTestTestProperties* p =
      this->Runner->GetTestProperties();
    if (p->TimeoutSignal) {
      this->TerminationStyle = Termination::Custom;
      uv_process_kill(this->Process, p->TimeoutSignal->Number);
      if (p->TimeoutGracePeriod) {
        this->Timeout = *p->TimeoutGracePeriod;
      } else {
        static const cmDuration defaultGracePeriod{ 1.0 };
        this->Timeout = defaultGracePeriod;
      }
      this->StartTimer();
      return;
    }
  }

  this->TerminationStyle = Termination::Forced;
  bool const was_still_reading = !this->ReadHandleClosed;
  if (!this->ReadHandleClosed) {
    this->ReadHandleClosed = true;
    this->PipeReader.reset();
  }
  if (!this->ProcessHandleClosed) {
    // Kill the child and let our on-exit handler finish the test.
    cmsysProcess_KillPID(static_cast<unsigned long>(this->Process->pid));
  } else if (was_still_reading) {
    // Our on-exit handler already ran but did not finish the test
    // because we were still reading output.  We've just dropped
    // our read handler, so we need to finish the test now.
    this->Finish();
  }
}